

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3PendingTermsFlush(Fts3Table *p)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < p->nIndex) {
    iVar2 = 0;
    do {
      iVar1 = fts3SegmentMerge(p,p->iPrevLangid,iVar2,-1);
      if ((iVar1 != 0x65) && (iVar1 != 0)) goto LAB_001d0ae3;
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->nIndex);
  }
  iVar1 = 0;
  if (((p->bHasStat == '\0') || (p->nAutoincrmerge != 0xff)) || (p->nLeafAdd == 0))
  goto LAB_001d0ae3;
  local_30 = (sqlite3_stmt *)0x0;
  iVar1 = fts3SqlStmt(p,0x16,&local_30,(sqlite3_value **)0x0);
  pStmt_00 = local_30;
  if (iVar1 != 0) goto LAB_001d0ae3;
  sqlite3_bind_int64(local_30,1,2);
  iVar1 = sqlite3_step(pStmt_00);
  iVar2 = 0;
  if (iVar1 == 0x65) {
LAB_001d0ad5:
    p->nAutoincrmerge = iVar2;
  }
  else if (iVar1 == 100) {
    iVar1 = sqlite3_column_int(pStmt_00,0);
    iVar2 = 8;
    if (iVar1 != 1) {
      iVar2 = iVar1;
    }
    goto LAB_001d0ad5;
  }
  iVar1 = sqlite3_reset(pStmt_00);
LAB_001d0ae3:
  if (iVar1 == 0) {
    sqlite3Fts3PendingTermsClear(p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3PendingTermsFlush(Fts3Table *p){
  int rc = SQLITE_OK;
  int i;

  for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
    rc = fts3SegmentMerge(p, p->iPrevLangid, i, FTS3_SEGCURSOR_PENDING);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }

  /* Determine the auto-incr-merge setting if unknown.  If enabled,
  ** estimate the number of leaf blocks of content to be written
  */
  if( rc==SQLITE_OK && p->bHasStat
   && p->nAutoincrmerge==0xff && p->nLeafAdd>0
  ){
    sqlite3_stmt *pStmt = 0;
    rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int(pStmt, 1, FTS_STAT_AUTOINCRMERGE);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        p->nAutoincrmerge = sqlite3_column_int(pStmt, 0);
        if( p->nAutoincrmerge==1 ) p->nAutoincrmerge = 8;
      }else if( rc==SQLITE_DONE ){
        p->nAutoincrmerge = 0;
      }
      rc = sqlite3_reset(pStmt);
    }
  }

  if( rc==SQLITE_OK ){
    sqlite3Fts3PendingTermsClear(p);
  }
  return rc;
}